

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset,size_t looper)

{
  CPpmd7 *p;
  CPpmd7z_RangeDec *rc;
  rar_filter **pprVar1;
  size_t *psVar2;
  rar *rar;
  size_t sVar3;
  void *pvVar4;
  long lVar5;
  rar_filter *prVar6;
  void *pvVar7;
  long lVar8;
  uint8_t *puVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  rar_filter **pprVar14;
  void *pvVar15;
  uchar *puVar16;
  ulong uVar17;
  uLong uVar18;
  char *fmt;
  void *__src;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  ulong uVar22;
  rar_filter *filter;
  int64_t end;
  long local_58;
  ulong local_50;
  size_t local_48;
  rar_br *local_40;
  ssize_t *local_38;
  
  if (0x400 < looper) {
    return -0x1e;
  }
  local_48 = looper + 1;
  rar = (rar *)a->format->data;
  local_40 = &rar->br;
  local_38 = &(rar->br).avail_in;
  p = &rar->ppmd7_context;
  rc = &rar->range_dec;
  iVar12 = 0;
LAB_0057425e:
  do {
    if (rar->valid == '\0') {
      return -0x1e;
    }
    sVar3 = (rar->filters).bytes_ready;
    if (sVar3 != 0) {
      uVar20 = rar->unp_offset;
      if ((ulong)uVar20 == 0) {
        puVar9 = (rar->filters).bytes;
        *buff = puVar9;
        *size = sVar3;
        rar->offset = rar->offset + sVar3;
        lVar5 = rar->offset_outgoing;
        *offset = lVar5;
        rar->offset_outgoing = lVar5 + *size;
        psVar2 = &(rar->filters).bytes_ready;
        *psVar2 = *psVar2 - *size;
        (rar->filters).bytes = puVar9 + *size;
        puVar16 = (uchar *)*buff;
        goto LAB_005748c4;
      }
      puVar16 = rar->unp_buffer;
      *buff = puVar16;
      *size = (ulong)uVar20;
      rar->unp_offset = 0;
LAB_00574856:
      lVar5 = rar->offset_outgoing;
      *offset = lVar5;
      rar->offset_outgoing = lVar5 + *size;
LAB_005748c4:
      uVar18 = cm_zlib_crc32(rar->crc_calculated,puVar16,(uInt)*size);
      rar->crc_calculated = uVar18;
      return iVar12;
    }
    if (rar->ppmd_eod != '\0') {
LAB_00574795:
      uVar20 = rar->unp_offset;
      if ((ulong)uVar20 != 0) {
        puVar16 = rar->unp_buffer;
        *buff = puVar16;
        *size = (ulong)uVar20;
        lVar5 = rar->offset_outgoing;
        *offset = lVar5;
        rar->offset_outgoing = lVar5 + *size;
        uVar18 = cm_zlib_crc32(rar->crc_calculated,puVar16,(uInt)*size);
        rar->crc_calculated = uVar18;
        rar->unp_offset = 0;
        return 0;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc == rar->crc_calculated) {
        rar->entry_eof = '\x01';
        return 1;
      }
      fmt = "File CRC error";
LAB_0057494e:
      archive_set_error(&a->archive,0x54,fmt);
      return -0x1e;
    }
    if (rar->dictionary_size == 0) {
LAB_005742af:
      if ((rar->filters).lastend == (rar->filters).filterstart) {
        pvVar4 = a->format->data;
        filter = *(rar_filter **)((long)pvVar4 + 0x3a0);
        if (filter == (rar_filter *)0x0) {
          return -0x1e;
        }
        lVar5 = *(long *)((long)pvVar4 + 0x3a8);
        local_50 = (ulong)filter->blocklength + lVar5;
        *(undefined8 *)((long)pvVar4 + 0x3a8) = 0x7fffffffffffffff;
        iVar10 = expand(a,(int64_t *)&local_50);
        uVar17 = local_50;
        if (iVar10 != 0) {
          return -0x1e;
        }
        pprVar1 = (rar_filter **)((long)pvVar4 + 0x3a0);
        pprVar14 = pprVar1;
        do {
          prVar6 = *pprVar14;
          if (prVar6 == (rar_filter *)0x0) {
            return -0x1e;
          }
          pprVar14 = &prVar6->next;
        } while (prVar6 != filter);
        if ((long)local_50 < 0) {
          return -0x1e;
        }
        uVar20 = filter->blocklength;
        if (local_50 != lVar5 + (ulong)uVar20) {
          return -0x1e;
        }
        pvVar15 = *(void **)((long)pvVar4 + 0x390);
        if (pvVar15 == (void *)0x0) {
          pvVar15 = calloc(1,0x40024);
          *(void **)((long)pvVar4 + 0x390) = pvVar15;
          if (pvVar15 == (void *)0x0) {
            return -0x1e;
          }
        }
        pvVar7 = a->format->data;
        uVar19 = (uint)lVar5 & *(uint *)((long)pvVar7 + 0x358);
        uVar11 = (*(uint *)((long)pvVar7 + 0x358) - uVar19) + 1;
        if ((int)uVar11 < 0) {
          fmt = "Bad RAR file data";
          goto LAB_0057494e;
        }
        __src = (void *)((long)(int)uVar19 + *(long *)((long)pvVar7 + 0x350));
        if (uVar20 - uVar11 != 0 && (int)uVar11 <= (int)uVar20) {
          memcpy((void *)((long)pvVar15 + 0x20),__src,(ulong)uVar11);
          __src = *(void **)((long)pvVar7 + 0x350);
          uVar20 = uVar20 - uVar11;
        }
        memcpy((void *)((long)pvVar15 + 0x20),__src,(long)(int)uVar20);
        while( true ) {
          iVar10 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar4 + 0x390),
                                  *(size_t *)((long)pvVar4 + 0xb8));
          if (iVar10 == 0) {
            return -0x1e;
          }
          uVar20 = filter->filteredblockaddress;
          uVar11 = filter->filteredblocklength;
          *pprVar1 = filter->next;
          filter->next = (rar_filter *)0x0;
          delete_filter(filter);
          filter = *pprVar1;
          if (filter == (rar_filter *)0x0) goto LAB_005746a9;
          uVar22 = filter->blockstartpos;
          if ((uVar22 != *(ulong *)((long)pvVar4 + 0x3a8)) || (filter->blocklength != uVar11))
          break;
          memmove((void *)(*(long *)((long)pvVar4 + 0x390) + 0x20),
                  (void *)(*(long *)((long)pvVar4 + 0x390) + (ulong)uVar20 + 0x20),(ulong)uVar11);
        }
        if (uVar22 < uVar17) {
          return -0x1e;
        }
        *(ulong *)((long)pvVar4 + 0x3a8) = uVar22;
LAB_005746a9:
        *(ulong *)((long)pvVar4 + 0x3b8) = uVar17;
        *(ulong *)((long)pvVar4 + 0x3c0) = *(long *)((long)pvVar4 + 0x390) + (ulong)uVar20 + 0x20;
        *(ulong *)((long)pvVar4 + 0x3c8) = (ulong)uVar11;
      }
      else {
        if (((rar->br).next_in == (uchar *)0x0) &&
           (iVar12 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
          puVar16 = (uchar *)rar_read_ahead(a,1,local_38);
          (rar->br).next_in = puVar16;
          if (puVar16 == (uchar *)0x0) {
            fmt = "Truncated RAR file data";
            goto LAB_0057494e;
          }
          if ((rar->br).cache_avail == 0) {
            rar_br_fillup(a,local_40);
          }
          iVar12 = 0;
        }
        if ((rar->start_new_table != '\0') && (iVar12 = parse_codes(a), iVar12 < -0x14)) {
          return iVar12;
        }
        if (rar->is_ppmd_block == '\0') {
          lVar5 = rar->offset;
          local_58 = (ulong)rar->dictionary_size + lVar5;
          lVar8 = (rar->filters).filterstart;
          if (lVar8 < local_58) {
            local_58 = lVar8;
          }
          iVar12 = expand(a,&local_58);
          if (iVar12 != 0) {
            return iVar12;
          }
          lVar8 = (rar->filters).filterstart;
          uVar17 = local_58 - lVar5;
          rar->bytes_uncopied = uVar17;
          (rar->filters).lastend = local_58;
          if (uVar17 == 0 && local_58 != lVar8) {
            fmt = "Internal error extracting RAR file";
            goto LAB_0057494e;
          }
        }
        else {
          iVar10 = Ppmd7_DecodeSymbol(p,&rc->p);
          if (iVar10 < 0) {
LAB_00574876:
            fmt = "Invalid symbol";
            goto LAB_0057494e;
          }
          if (iVar10 == rar->ppmd_escape) {
            iVar13 = Ppmd7_DecodeSymbol(p,&rc->p);
            if (iVar13 < 0) goto LAB_00574876;
            switch(iVar13) {
            case 0:
              rar->start_new_table = '\x01';
              iVar12 = read_data_compressed(a,buff,size,offset,local_48);
              return iVar12;
            default:
              goto switchD_005744c9_caseD_1;
            case 2:
              rar->ppmd_eod = '\x01';
              goto LAB_005746e8;
            case 3:
              archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
              return -0x19;
            case 4:
              uVar20 = 0;
              bVar21 = 0x10;
              for (iVar12 = 2; iVar10 = Ppmd7_DecodeSymbol(p,&rc->p), -1 < iVar12;
                  iVar12 = iVar12 + -1) {
                if (iVar10 < 0) goto LAB_0057486d;
                uVar20 = uVar20 | iVar10 << (bVar21 & 0x1f);
                bVar21 = bVar21 - 8;
              }
              if (iVar10 < 0) {
LAB_0057486d:
                fmt = "Invalid symbol";
                goto LAB_0057494e;
              }
              uVar17 = (ulong)(iVar10 + 0x20U);
              lzss_emit_match(rar,uVar20 + 2,iVar10 + 0x20U);
              break;
            case 5:
              iVar12 = Ppmd7_DecodeSymbol(p,&rc->p);
              if (iVar12 < 0) goto LAB_00574876;
              uVar17 = (ulong)(iVar12 + 4U);
              lzss_emit_match(rar,1,iVar12 + 4U);
            }
          }
          else {
switchD_005744c9_caseD_1:
            lzss_emit_literal(rar,(uint8_t)iVar10);
            uVar17 = 1;
          }
          uVar17 = uVar17 + rar->bytes_uncopied;
          rar->bytes_uncopied = uVar17;
        }
        uVar22 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
        if ((long)uVar17 < (long)uVar22) {
          uVar22 = uVar17;
        }
        iVar12 = copy_from_lzss_window_to_unp(a,buff,rar->offset,(int)uVar22);
        if (iVar12 != 0) {
          return iVar12;
        }
        rar->offset = rar->offset + uVar22;
        rar->bytes_uncopied = rar->bytes_uncopied - uVar22;
        iVar12 = 0;
      }
LAB_005746e8:
      puVar16 = (uchar *)*buff;
      if (puVar16 != (uchar *)0x0) {
        rar->unp_offset = 0;
        *size = (ulong)rar->unp_buffer_size;
        goto LAB_00574856;
      }
      goto LAB_0057425e;
    }
    if (rar->unp_size <= rar->offset) goto LAB_00574795;
    if ((rar->is_ppmd_block != '\0') || (uVar17 = rar->bytes_uncopied, (long)uVar17 < 1))
    goto LAB_005742af;
    uVar22 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
    if (uVar17 < uVar22) {
      uVar22 = uVar17;
    }
    iVar12 = copy_from_lzss_window_to_unp(a,buff,rar->offset,(int)uVar22);
    if (iVar12 != 0) {
      return iVar12;
    }
    rar->offset = rar->offset + uVar22;
    rar->bytes_uncopied = rar->bytes_uncopied - uVar22;
    puVar16 = (uchar *)*buff;
    iVar12 = 0;
    if (puVar16 != (uchar *)0x0) {
      rar->unp_offset = 0;
      *size = (ulong)rar->unp_buffer_size;
      lVar5 = rar->offset_outgoing;
      *offset = lVar5;
      rar->offset_outgoing = lVar5 + *size;
      uVar18 = cm_zlib_crc32(rar->crc_calculated,puVar16,(uInt)*size);
      rar->crc_calculated = uVar18;
      return 0;
    }
  } while( true );
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
                     int64_t *offset, size_t looper)
{
  if (looper++ > MAX_COMPRESS_DEPTH)
    return (ARCHIVE_FATAL);

  struct rar *rar;
  int64_t start, end;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);

    if (rar->filters.bytes_ready > 0)
    {
      /* Flush unp_buffer first */
      if (rar->unp_offset > 0)
      {
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        rar->unp_offset = 0;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
      }
      else
      {
        *buff = rar->filters.bytes;
        *size = rar->filters.bytes_ready;

        rar->offset += *size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;

        rar->filters.bytes_ready -= *size;
        rar->filters.bytes += *size;
      }
      goto ending_block;
    }

    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, (int)bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (rar->filters.lastend == rar->filters.filterstart)
    {
      if (!run_filters(a))
        return (ARCHIVE_FATAL);
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset, looper);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;
      if (rar->filters.filterstart < end) {
        end = rar->filters.filterstart;
      }

      ret = expand(a, &end);
      if (ret != ARCHIVE_OK)
	      return (ret);

      rar->bytes_uncopied = end - start;
      rar->filters.lastend = end;
      if (rar->filters.lastend != rar->filters.filterstart && rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, (int)bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
ending_block:
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}